

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWriteVer.c
# Opt level: O1

void Wlc_WriteTables(FILE *pFile,Wlc_Ntk_t *p)

{
  uint uVar1;
  Wlc_Obj_t *pWVar2;
  uint uVar3;
  int iVar4;
  void *__s;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar12;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar11;
  
  if (p->vTables != (Vec_Ptr_t *)0x0) {
    uVar1 = p->vTables->nSize;
    if ((long)(int)uVar1 != 0) {
      uVar3 = 0x10;
      if (0x10 < uVar1) {
        uVar3 = uVar1;
      }
      __s = malloc((long)(int)uVar3 << 2);
      if (__s != (void *)0x0) {
        memset(__s,0,(long)(int)uVar1 * 4);
      }
      iVar8 = p->iObj;
      if (1 < (long)iVar8) {
        uVar6 = 1;
        if (1 < p->nObjsAlloc) {
          uVar6 = (ulong)(uint)p->nObjsAlloc;
        }
        uVar7 = 1;
        lVar9 = 0x2c;
        do {
          if (uVar6 == uVar7) goto LAB_0035839b;
          if ((*(ushort *)((long)p->pObjs + lVar9 + -0x14) & 0x3f) == 0x35) {
            iVar12 = *(int *)(&p->pObjs->field_0x0 + lVar9);
            if (((long)iVar12 < 0) || ((int)uVar1 <= iVar12)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(int *)((long)__s + (long)iVar12 * 4) = (int)uVar7;
          }
          uVar7 = uVar7 + 1;
          lVar9 = lVar9 + 0x18;
        } while ((long)iVar8 != uVar7);
      }
      pVVar5 = p->vTables;
      if (0 < pVVar5->nSize) {
        uVar7 = 0;
        uVar6 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar6 = uVar7;
        }
        do {
          if (uVar6 == uVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar8 = *(int *)((long)__s + uVar7 * 4);
          lVar9 = (long)iVar8;
          if ((lVar9 < 1) || (p->nObjsAlloc <= iVar8)) {
LAB_0035839b:
            __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                          ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
          }
          pWVar2 = p->pObjs;
          if ((undefined1  [24])((undefined1  [24])pWVar2[lVar9] & (undefined1  [24])0x3f) !=
              (undefined1  [24])0x35) {
            __assert_fail("pObj->Type == WLC_OBJ_TABLE",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcWriteVer.c"
                          ,0x51,"void Wlc_WriteTables(FILE *, Wlc_Ntk_t *)");
          }
          paVar11 = &pWVar2[lVar9].field_10;
          if (2 < pWVar2[lVar9].nFanins) {
            paVar11 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar11->pFanins[0];
          }
          lVar10 = (long)paVar11->Fanins[0];
          if ((lVar10 < 1) || (p->nObjsAlloc <= paVar11->Fanins[0])) goto LAB_0035839b;
          iVar12 = pWVar2[lVar10].End - pWVar2[lVar10].Beg;
          iVar8 = -iVar12;
          if (0 < iVar12) {
            iVar8 = iVar12;
          }
          iVar4 = pWVar2[lVar9].End - pWVar2[lVar9].Beg;
          iVar12 = -iVar4;
          if (0 < iVar4) {
            iVar12 = iVar4;
          }
          Wlc_WriteTableOne(pFile,iVar8 + 1,iVar12 + 1,(word *)pVVar5->pArray[uVar7],(int)uVar7);
          uVar7 = uVar7 + 1;
          pVVar5 = p->vTables;
        } while ((long)uVar7 < (long)pVVar5->nSize);
      }
      if (__s != (void *)0x0) {
        free(__s);
        return;
      }
    }
  }
  return;
}

Assistant:

void Wlc_WriteTables( FILE * pFile, Wlc_Ntk_t * p )
{
    Vec_Int_t * vNodes;
    Wlc_Obj_t * pObj, * pFanin;
    word * pTable;
    int i;
    if ( p->vTables == NULL || Vec_PtrSize(p->vTables) == 0 )
        return;
    // map tables into their nodes
    vNodes = Vec_IntStart( Vec_PtrSize(p->vTables) );
    Wlc_NtkForEachObj( p, pObj, i )
        if ( pObj->Type == WLC_OBJ_TABLE )
            Vec_IntWriteEntry( vNodes, Wlc_ObjTableId(pObj), i );
    // write tables
    Vec_PtrForEachEntry( word *, p->vTables, pTable, i )
    {
        pObj = Wlc_NtkObj( p, Vec_IntEntry(vNodes, i) );
        assert( pObj->Type == WLC_OBJ_TABLE );
        pFanin = Wlc_ObjFanin0( p, pObj );
        Wlc_WriteTableOne( pFile, Wlc_ObjRange(pFanin), Wlc_ObjRange(pObj), pTable, i );
    }
    Vec_IntFree( vNodes );
}